

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_imm_ea(m68k_info *info,int opcode,uint8_t size,int imm)

{
  undefined7 in_register_00000011;
  m68k_cpu_size size_00;
  
  MCInst_setOpcode(info->inst,opcode);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  size_00 = (m68k_cpu_size)CONCAT71(in_register_00000011,size);
  (info->extension).op_size.field_1.cpu_size = size_00;
  (info->extension).operands[0].type = M68K_OP_IMM;
  (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
  (info->extension).operands[0].field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)imm;
  get_ea_mode_op(info,(info->extension).operands + 1,info->ir,size_00);
  return;
}

Assistant:

static void build_imm_ea(m68k_info *info, int opcode, uint8_t size, int imm)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_IMM;
	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->imm = imm;

	get_ea_mode_op(info, op1, info->ir, size);
}